

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase1477::run(TestCase1477 *this)

{
  StructDataBitCount *this_00;
  Builder builder_00;
  Reader reader;
  Reader reader_00;
  Reader reader_01;
  Reader reader_02;
  undefined8 in_stack_fffffffffffffcd0;
  undefined8 in_stack_fffffffffffffcd8;
  undefined1 local_280 [40];
  Reader local_258;
  undefined1 auStack_228 [8];
  Reader oldSub2;
  Reader oldSub;
  undefined1 auStack_198 [8];
  Reader oldRoot;
  undefined1 auStack_128 [8];
  Builder root;
  MallocMessageBuilder builder;
  TestCase1477 *this_local;
  
  this_00 = &root._builder.dataSize;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            ((Builder *)auStack_128,(MessageBuilder *)this_00);
  oldRoot._reader._40_8_ = auStack_128;
  builder_00._builder.capTable = root._builder.capTable;
  builder_00._builder.segment = root._builder.segment;
  builder_00._builder.data = root._builder.data;
  builder_00._builder.pointers = root._builder.pointers;
  builder_00._builder.dataSize = (int)in_stack_fffffffffffffcd0;
  builder_00._builder.pointerCount = (short)((ulong)in_stack_fffffffffffffcd0 >> 0x20);
  builder_00._builder._38_2_ = (short)((ulong)in_stack_fffffffffffffcd0 >> 0x30);
  initTestMessage(builder_00);
  capnproto_test::capnp::test::TestAllTypes::Builder::asReader
            ((Reader *)auStack_198,(Builder *)auStack_128);
  reader._reader.capTable = oldRoot._reader.capTable;
  reader._reader.segment = oldRoot._reader.segment;
  reader._reader.data = oldRoot._reader.data;
  reader._reader.pointers = oldRoot._reader.pointers;
  reader._reader.dataSize = oldRoot._reader.dataSize;
  reader._reader.pointerCount = oldRoot._reader.pointerCount;
  reader._reader._38_2_ = oldRoot._reader._38_2_;
  reader._reader._40_8_ = in_stack_fffffffffffffcd8;
  checkTestMessage(reader);
  capnproto_test::capnp::test::TestAllTypes::Reader::getStructField
            ((Reader *)&oldSub2._reader.nestingLimit,(Reader *)auStack_198);
  capnproto_test::capnp::test::TestAllTypes::Reader::getStructList(&local_258,(Reader *)auStack_198)
  ;
  List<capnproto_test::capnp::test::TestAllTypes,_(capnp::Kind)3>::Reader::operator[]
            ((Reader *)auStack_228,&local_258,0);
  MessageBuilder::initRoot<capnproto_test::capnp::test::TestAllTypes>
            ((Builder *)local_280,(MessageBuilder *)&root._builder.dataSize);
  root._builder.pointers = (WirePointer *)local_280._32_8_;
  root._builder.capTable = (CapTableBuilder *)local_280._16_8_;
  root._builder.data = (void *)local_280._24_8_;
  auStack_128 = (undefined1  [8])local_280._0_8_;
  root._builder.segment = (SegmentBuilder *)local_280._8_8_;
  reader_00._reader.capTable = oldRoot._reader.capTable;
  reader_00._reader.segment = oldRoot._reader.segment;
  reader_00._reader.data = oldRoot._reader.data;
  reader_00._reader.pointers = oldRoot._reader.pointers;
  reader_00._reader.dataSize = oldRoot._reader.dataSize;
  reader_00._reader.pointerCount = oldRoot._reader.pointerCount;
  reader_00._reader._38_2_ = oldRoot._reader._38_2_;
  reader_00._reader._40_8_ = in_stack_fffffffffffffcd8;
  checkTestMessageAllZero(reader_00);
  reader_01._reader.capTable = oldSub._reader.capTable;
  reader_01._reader.segment = oldSub._reader.segment;
  reader_01._reader.data = oldSub._reader.data;
  reader_01._reader.pointers = oldSub._reader.pointers;
  reader_01._reader._32_8_ = oldSub._reader._32_8_;
  reader_01._reader._40_8_ = in_stack_fffffffffffffcd8;
  checkTestMessageAllZero(reader_01);
  reader_02._reader.capTable = oldSub2._reader.capTable;
  reader_02._reader.segment = oldSub2._reader.segment;
  reader_02._reader.data = oldSub2._reader.data;
  reader_02._reader.pointers = oldSub2._reader.pointers;
  reader_02._reader.dataSize = oldSub2._reader.dataSize;
  reader_02._reader.pointerCount = oldSub2._reader.pointerCount;
  reader_02._reader._38_2_ = oldSub2._reader._38_2_;
  reader_02._reader._40_8_ = in_stack_fffffffffffffcd8;
  checkTestMessageAllZero(reader_02);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root._builder.dataSize);
  return;
}

Assistant:

TEST(Encoding, ZeroOldObject) {
  MallocMessageBuilder builder;

  auto root = builder.initRoot<TestAllTypes>();
  initTestMessage(root);

  auto oldRoot = root.asReader();
  checkTestMessage(oldRoot);

  auto oldSub = oldRoot.getStructField();
  auto oldSub2 = oldRoot.getStructList()[0];

  root = builder.initRoot<TestAllTypes>();
  checkTestMessageAllZero(oldRoot);
  checkTestMessageAllZero(oldSub);
  checkTestMessageAllZero(oldSub2);
}